

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

GenericDatum __thiscall avro::makeGenericDatum(avro *this,NodePtr *n,Entity *e,SymbolTable *st)

{
  Bool v;
  __type _Var1;
  int iVar2;
  undefined4 extraout_var;
  const_iterator cVar3;
  undefined4 extraout_var_00;
  _Base_ptr p_Var4;
  Object *pOVar5;
  Long LVar6;
  String *pSVar7;
  Array *pAVar8;
  undefined4 extraout_var_01;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  const_iterator cVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar10;
  Name *this_01;
  undefined4 extraout_var_07;
  Exception *pEVar11;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  placeholder *extraout_RDX;
  placeholder *extraout_RDX_00;
  placeholder *extraout_RDX_01;
  placeholder *extraout_RDX_02;
  placeholder *extraout_RDX_03;
  placeholder *extraout_RDX_04;
  placeholder *extraout_RDX_05;
  placeholder *extraout_RDX_06;
  placeholder *extraout_RDX_07;
  placeholder *extraout_RDX_08;
  placeholder *extraout_RDX_09;
  placeholder *extraout_RDX_10;
  placeholder *extraout_RDX_11;
  any aVar13;
  ulong uVar14;
  GenericArray *this_02;
  long lVar15;
  pointer e_00;
  Double DVar16;
  GenericDatum GVar17;
  Type t;
  GenericMap result;
  Type t_1;
  Entity e2;
  NodePtr local_190;
  NodePtr local_180;
  NodePtr local_170;
  string name;
  NodePtr local_140;
  string local_130;
  GenericArray result_2;
  undefined4 extraout_var_06;
  
  t = n->px->type_;
  if (t == AVRO_NUM_TYPES) {
    iVar2 = (*n->px->_vptr_Node[3])();
    cVar3 = std::
            _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
            ::find(&st->_M_t,(key_type *)CONCAT44(extraout_var,iVar2));
    boost::shared_ptr<avro::Node>::operator=(n,(shared_ptr<avro::Node> *)(cVar3._M_node + 3));
    t = n->px->type_;
  }
  switch(t) {
  case AVRO_STRING:
    assertType(e,etString);
    pSVar7 = json::Entity::stringValue_abi_cxx11_(e);
    GenericDatum::GenericDatum((GenericDatum *)this,pSVar7);
    aVar13.content = extraout_RDX;
    break;
  case AVRO_BYTES:
    assertType(e,etString);
    pSVar7 = json::Entity::stringValue_abi_cxx11_(e);
    toBin((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result_2,pSVar7);
    GenericDatum::GenericDatum
              ((GenericDatum *)this,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result_2);
    this_02 = &result_2;
    goto LAB_00164f6c;
  case AVRO_INT:
    assertType(e,etLong);
    LVar6 = json::Entity::longValue(e);
    GenericDatum::GenericDatum((GenericDatum *)this,(int32_t)LVar6);
    aVar13.content = extraout_RDX_02;
    break;
  case AVRO_LONG:
    assertType(e,etLong);
    LVar6 = json::Entity::longValue(e);
    GenericDatum::GenericDatum((GenericDatum *)this,LVar6);
    aVar13.content = extraout_RDX_03;
    break;
  case AVRO_FLOAT:
    assertType(e,etDouble);
    DVar16 = json::Entity::doubleValue(e);
    GenericDatum::GenericDatum((GenericDatum *)this,(float)DVar16);
    aVar13.content = extraout_RDX_00;
    break;
  case AVRO_DOUBLE:
    assertType(e,etDouble);
    DVar16 = json::Entity::doubleValue(e);
    GenericDatum::GenericDatum((GenericDatum *)this,DVar16);
    aVar13.content = extraout_RDX_05;
    break;
  case AVRO_BOOL:
    assertType(e,etBool);
    v = json::Entity::boolValue(e);
    GenericDatum::GenericDatum((GenericDatum *)this,v);
    aVar13.content = extraout_RDX_07;
    break;
  case AVRO_NULL:
    assertType(e,etNull);
    *(undefined4 *)this = 7;
    *(undefined8 *)(this + 8) = 0;
    aVar13.content = extraout_RDX_04;
    break;
  case AVRO_RECORD:
    assertType(e,etObject);
    GenericRecord::GenericRecord((GenericRecord *)&result,n);
    this_00 = &json::Entity::objectValue_abi_cxx11_(e)->_M_t;
    lVar15 = 0;
    for (uVar14 = 0; iVar2 = (*n->px->_vptr_Node[4])(), uVar14 < CONCAT44(extraout_var_02,iVar2);
        uVar14 = uVar14 + 1) {
      iVar2 = (*n->px->_vptr_Node[8])(n->px,uVar14 & 0xffffffff);
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
              ::find(this_00,(key_type *)CONCAT44(extraout_var_03,iVar2));
      if ((_Rb_tree_header *)cVar9._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
        pEVar11 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
                   "No value found in default for %1%");
        iVar2 = (*n->px->_vptr_Node[8])(n->px,uVar14 & 0xffffffff);
        pbVar12 = boost::io::detail::
                  feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result_2,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_07,iVar2));
        Exception::Exception(pEVar11,pbVar12);
        __cxa_throw(pEVar11,&Exception::typeinfo,Exception::~Exception);
      }
      iVar2 = (*n->px->_vptr_Node[5])(n->px,uVar14 & 0xffffffff);
      local_170.px = *(element_type **)CONCAT44(extraout_var_04,iVar2);
      local_170.pn.pi_ = (sp_counted_base *)((undefined8 *)CONCAT44(extraout_var_04,iVar2))[1];
      if (local_170.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_170.pn.pi_)->use_count_ = (local_170.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      makeGenericDatum((avro *)&result_2,&local_170,(Entity *)(cVar9._M_node + 2),st);
      GenericDatum::operator=
                ((GenericDatum *)
                 ((long)&((result.value_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                 lVar15),(GenericDatum *)&result_2);
      if (result_2.super_GenericContainer.schema_.pn.pi_ != (sp_counted_base *)0x0) {
        (*(result_2.super_GenericContainer.schema_.pn.pi_)->_vptr_sp_counted_base[1])();
      }
      boost::detail::shared_count::~shared_count(&local_170.pn);
      lVar15 = lVar15 + 0x10;
    }
    GenericDatum::GenericDatum<avro::GenericRecord>((GenericDatum *)this,n,(GenericRecord *)&result)
    ;
    GenericRecord::~GenericRecord((GenericRecord *)&result);
    aVar13.content = extraout_RDX_10;
    break;
  case AVRO_ENUM:
    assertType(e,etString);
    pSVar7 = json::Entity::stringValue_abi_cxx11_(e);
    GenericEnum::GenericEnum((GenericEnum *)&result_2,n,pSVar7);
    GenericDatum::GenericDatum<avro::GenericEnum>((GenericDatum *)this,n,(GenericEnum *)&result_2);
    boost::detail::shared_count::~shared_count(&result_2.super_GenericContainer.schema_.pn);
    aVar13.content = extraout_RDX_01;
    break;
  case AVRO_ARRAY:
    assertType(e,etArray);
    GenericArray::GenericArray(&result_2,n);
    pAVar8 = json::Entity::arrayValue(e);
    for (e_00 = (pAVar8->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>
                )._M_impl.super__Vector_impl_data._M_start;
        e_00 != (pAVar8->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>
                )._M_impl.super__Vector_impl_data._M_finish; e_00 = e_00 + 1) {
      iVar2 = (*n->px->_vptr_Node[5])(n->px,0);
      local_180.px = *(element_type **)CONCAT44(extraout_var_01,iVar2);
      local_180.pn.pi_ = (sp_counted_base *)((undefined8 *)CONCAT44(extraout_var_01,iVar2))[1];
      if (local_180.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_180.pn.pi_)->use_count_ = (local_180.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      makeGenericDatum((avro *)&result,&local_180,e_00,st);
      std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::
      emplace_back<avro::GenericDatum>(&result_2.value_,(GenericDatum *)&result);
      if (result.super_GenericContainer.schema_.pn.pi_ != (sp_counted_base *)0x0) {
        (*(result.super_GenericContainer.schema_.pn.pi_)->_vptr_sp_counted_base[1])();
      }
      boost::detail::shared_count::~shared_count(&local_180.pn);
    }
    GenericDatum::GenericDatum<avro::GenericArray>((GenericDatum *)this,n,&result_2);
    GenericArray::~GenericArray(&result_2);
    aVar13.content = extraout_RDX_08;
    break;
  case AVRO_MAP:
    assertType(e,etObject);
    GenericMap::GenericMap(&result,n);
    pOVar5 = json::Entity::objectValue_abi_cxx11_(e);
    for (p_Var4 = (pOVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pOVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      iVar2 = (*n->px->_vptr_Node[5])(n->px,1);
      local_190.px = *(element_type **)CONCAT44(extraout_var_00,iVar2);
      local_190.pn.pi_ = (sp_counted_base *)((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1];
      if (local_190.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_190.pn.pi_)->use_count_ = (local_190.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      makeGenericDatum((avro *)&name,&local_190,(Entity *)(p_Var4 + 2),st);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
      ::pair<avro::GenericDatum,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
                  *)&result_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1),
                 (GenericDatum *)&name);
      std::
      vector<std::pair<std::__cxx11::string,avro::GenericDatum>,std::allocator<std::pair<std::__cxx11::string,avro::GenericDatum>>>
      ::emplace_back<std::pair<std::__cxx11::string,avro::GenericDatum>>
                ((vector<std::pair<std::__cxx11::string,avro::GenericDatum>,std::allocator<std::pair<std::__cxx11::string,avro::GenericDatum>>>
                  *)&result.value_,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
                  *)&result_2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
               *)&result_2);
      if (name._M_string_length != 0) {
        (**(code **)(*(long *)name._M_string_length + 8))();
      }
      boost::detail::shared_count::~shared_count(&local_190.pn);
    }
    GenericDatum::GenericDatum<avro::GenericMap>((GenericDatum *)this,n,&result);
    GenericMap::~GenericMap(&result);
    aVar13.content = extraout_RDX_09;
    break;
  case AVRO_UNION:
    GenericUnion::GenericUnion((GenericUnion *)&result,n);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    e2.type_ = etNull;
    e2.value_.content = (placeholder *)0x0;
    name.field_2._M_local_buf[0] = '\0';
    if (e->type_ == etNull) {
      std::__cxx11::string::assign((char *)&name);
      json::Entity::operator=(&e2,e);
    }
    else {
      assertType(e,etObject);
      pOVar5 = json::Entity::objectValue_abi_cxx11_(e);
      if ((pOVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
        pEVar11 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
                   "Default value for union has more than one field: %1%");
        json::Entity::toString_abi_cxx11_(&local_130,e);
        pbVar12 = boost::io::detail::
                  feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result_2,&local_130);
        Exception::Exception(pEVar11,pbVar12);
        __cxa_throw(pEVar11,&Exception::typeinfo,Exception::~Exception);
      }
      p_Var4 = (pOVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_assign((string *)&name);
      json::Entity::operator=(&e2,(Entity *)(p_Var4 + 2));
    }
    uVar14 = 0;
    while( true ) {
      iVar2 = (*n->px->_vptr_Node[4])();
      if (CONCAT44(extraout_var_05,iVar2) <= uVar14) {
        pEVar11 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
                   "Invalid default value %1%");
        json::Entity::toString_abi_cxx11_(&local_130,e);
        pbVar12 = boost::io::detail::
                  feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result_2,&local_130);
        Exception::Exception(pEVar11,pbVar12);
        __cxa_throw(pEVar11,&Exception::typeinfo,Exception::~Exception);
      }
      iVar2 = (*n->px->_vptr_Node[5])(n->px,uVar14 & 0xffffffff);
      plVar10 = (long *)CONCAT44(extraout_var_06,iVar2);
      t_1 = *(Type *)((long *)*plVar10 + 1);
      switch(t_1) {
      case AVRO_STRING:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"string",(allocator<char> *)&result_2);
        break;
      case AVRO_BYTES:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"bytes",(allocator<char> *)&result_2);
        break;
      case AVRO_INT:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"int",(allocator<char> *)&result_2);
        break;
      case AVRO_LONG:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"long",(allocator<char> *)&result_2);
        break;
      case AVRO_FLOAT:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"float",(allocator<char> *)&result_2);
        break;
      case AVRO_DOUBLE:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"double",(allocator<char> *)&result_2);
        break;
      case AVRO_BOOL:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"boolean",(allocator<char> *)&result_2);
        break;
      case AVRO_NULL:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"null",(allocator<char> *)&result_2);
        break;
      case AVRO_RECORD:
      case AVRO_ENUM:
      case AVRO_FIXED:
      case AVRO_NUM_TYPES:
        this_01 = (Name *)(**(code **)(*(long *)*plVar10 + 0x18))();
        Name::fullname_abi_cxx11_(&local_130,this_01);
        break;
      case AVRO_ARRAY:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"array",(allocator<char> *)&result_2);
        break;
      case AVRO_MAP:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"map",(allocator<char> *)&result_2);
        break;
      case AVRO_UNION:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"union",(allocator<char> *)&result_2);
        break;
      default:
        pEVar11 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
                   "Unknown type: %1%");
        pbVar12 = boost::io::detail::
                  feed<char,std::char_traits<char>,std::allocator<char>,avro::Type&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result_2,&t_1);
        Exception::Exception(pEVar11,pbVar12);
        __cxa_throw(pEVar11,&Exception::typeinfo,Exception::~Exception);
      }
      _Var1 = std::operator==(&local_130,&name);
      std::__cxx11::string::~string((string *)&local_130);
      if (_Var1) break;
      uVar14 = uVar14 + 1;
    }
    GenericUnion::selectBranch((GenericUnion *)&result,uVar14);
    local_140.px = (element_type *)*plVar10;
    local_140.pn.pi_ = (sp_counted_base *)plVar10[1];
    if (local_140.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_140.pn.pi_)->use_count_ = (local_140.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    makeGenericDatum((avro *)&result_2,&local_140,&e2,st);
    GenericDatum::operator=
              ((GenericDatum *)
               &result.value_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(GenericDatum *)&result_2);
    if (result_2.super_GenericContainer.schema_.pn.pi_ != (sp_counted_base *)0x0) {
      (*(result_2.super_GenericContainer.schema_.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    boost::detail::shared_count::~shared_count(&local_140.pn);
    GenericDatum::GenericDatum<avro::GenericUnion>((GenericDatum *)this,n,(GenericUnion *)&result);
    if (e2.value_.content != (placeholder *)0x0) {
      (*(e2.value_.content)->_vptr_placeholder[1])();
    }
    std::__cxx11::string::~string((string *)&name);
    GenericUnion::~GenericUnion((GenericUnion *)&result);
    aVar13.content = extraout_RDX_11;
    break;
  case AVRO_FIXED:
    assertType(e,etString);
    pSVar7 = json::Entity::stringValue_abi_cxx11_(e);
    toBin((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result,pSVar7);
    GenericFixed::GenericFixed
              ((GenericFixed *)&result_2,n,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result);
    GenericDatum::GenericDatum<avro::GenericFixed>((GenericDatum *)this,n,(GenericFixed *)&result_2)
    ;
    GenericFixed::~GenericFixed((GenericFixed *)&result_2);
    this_02 = (GenericArray *)&result;
LAB_00164f6c:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    aVar13.content = extraout_RDX_06;
    break;
  default:
    pEVar11 = (Exception *)__cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_2,
               "Unknown type: %1%");
    pbVar12 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,avro::Type&>
                        ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result_2,&t);
    Exception::Exception(pEVar11,pbVar12);
    __cxa_throw(pEVar11,&Exception::typeinfo,Exception::~Exception);
  }
  GVar17.value_.content = aVar13.content;
  GVar17._0_8_ = this;
  return GVar17;
}

Assistant:

static GenericDatum makeGenericDatum(NodePtr n, const Entity& e,
    const SymbolTable& st)
{
    Type t = n->type();
    if (t == AVRO_SYMBOLIC) {
        n = st.find(n->name())->second;
        t = n->type();
    }
    switch (t) {
    case AVRO_STRING:
        assertType(e, json::etString);
        return GenericDatum(e.stringValue());
    case AVRO_BYTES:
        assertType(e, json::etString);
        return GenericDatum(toBin(e.stringValue()));
    case AVRO_INT:
        assertType(e, json::etLong);
        return GenericDatum(static_cast<int32_t>(e.longValue()));
    case AVRO_LONG:
        assertType(e, json::etLong);
        return GenericDatum(e.longValue());
    case AVRO_FLOAT:
        assertType(e, json::etDouble);
        return GenericDatum(static_cast<float>(e.doubleValue()));
    case AVRO_DOUBLE:
        assertType(e, json::etDouble);
        return GenericDatum(e.doubleValue());
    case AVRO_BOOL:
        assertType(e, json::etBool);
        return GenericDatum(e.boolValue());
    case AVRO_NULL:
        assertType(e, json::etNull);
        return GenericDatum();
    case AVRO_RECORD:
    {
        assertType(e, json::etObject);
        GenericRecord result(n);
        const map<string, Entity>& v = e.objectValue();
        for (size_t i = 0; i < n->leaves(); ++i) {
            map<string, Entity>::const_iterator it = v.find(n->nameAt(i));
            if (it == v.end()) {
                throw Exception(boost::format(
                    "No value found in default for %1%") % n->nameAt(i));
            }
            result.setFieldAt(i,
                makeGenericDatum(n->leafAt(i), it->second, st));
        }
        return GenericDatum(n, result);
    }
    case AVRO_ENUM:
        assertType(e, json::etString);
        return GenericDatum(n, GenericEnum(n, e.stringValue()));
    case AVRO_ARRAY:
    {
        assertType(e, json::etArray);
        GenericArray result(n);
        const vector<Entity>& elements = e.arrayValue();
        for (vector<Entity>::const_iterator it = elements.begin();
            it != elements.end(); ++it) {
            result.value().push_back(makeGenericDatum(n->leafAt(0), *it, st));
        }
        return GenericDatum(n, result);
    }
    case AVRO_MAP:
    {
        assertType(e, json::etObject);
        GenericMap result(n);
        const map<string, Entity>& v = e.objectValue();
        for (map<string, Entity>::const_iterator it = v.begin();
            it != v.end(); ++it) {
            result.value().push_back(make_pair(it->first,
                makeGenericDatum(n->leafAt(1), it->second, st)));
        }
        return GenericDatum(n, result);
    }
    case AVRO_UNION:
    {
        GenericUnion result(n);
        string name;
        Entity e2;
        if (e.type() == json::etNull) {
            name = "null";
            e2 = e;
        } else {
            assertType(e, json::etObject);
            const map<string, Entity>& v = e.objectValue();
            if (v.size() != 1) {
                throw Exception(boost::format("Default value for "
                    "union has more than one field: %1%") % e.toString());
            }
            map<string, Entity>::const_iterator it = v.begin();
            name = it->first;
            e2 = it->second;
        }
        for (size_t i = 0; i < n->leaves(); ++i) {
            const NodePtr& b = n->leafAt(i);
            if (nameof(b) == name) {
                result.selectBranch(i);
                result.datum() = makeGenericDatum(b, e2, st);
                return GenericDatum(n, result);
            }
        }
        throw Exception(boost::format("Invalid default value %1%") %
            e.toString());
    }
    case AVRO_FIXED:
        assertType(e, json::etString);
        return GenericDatum(n, GenericFixed(n, toBin(e.stringValue())));
    default:
        throw Exception(boost::format("Unknown type: %1%") % t);
    }
    return GenericDatum();
}